

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pairwise_tests.cpp
# Opt level: O0

void __thiscall iu_PairwiseTest_x_iutest_x_Num_Test::Body(iu_PairwiseTest_x_iutest_x_Num_Test *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  __tuple_element_t<5UL,_tuple<int,_int,_int,_int,_int,_int,_int,_int,_int>_> _Var6;
  __tuple_element_t<6UL,_tuple<int,_int,_int,_int,_int,_int,_int,_int,_int>_> _Var7;
  __tuple_element_t<7UL,_tuple<int,_int,_int,_int,_int,_int,_int,_int,_int>_> _Var8;
  ParamType *__src;
  uint *puVar9;
  __tuple_element_t<5UL,_tuple<int,_int,_int,_int,_int,_int,_int,_int,_int>_> *p_Var10;
  __tuple_element_t<6UL,_tuple<int,_int,_int,_int,_int,_int,_int,_int,_int>_> *p_Var11;
  __tuple_element_t<7UL,_tuple<int,_int,_int,_int,_int,_int,_int,_int,_int>_> *p_Var12;
  __tuple_element_t<8UL,_tuple<int,_int,_int,_int,_int,_int,_int,_int,_int>_> *p_Var13;
  undefined1 local_3c [8];
  PairwiseTestTuple param;
  iu_PairwiseTest_x_iutest_x_Num_Test *this_local;
  
  param.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>._28_8_ = this;
  __src = iutest::WithParamInterface<std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int>_>::
          GetParam();
  memcpy(local_3c,__src,0x24);
  puVar9 = (uint *)std::get<0ul,int,int,int,int,int,int,int,int,int>
                             ((tuple<int,_int,_int,_int,_int,_int,_int,_int,_int> *)local_3c);
  uVar1 = *puVar9;
  puVar9 = (uint *)std::get<1ul,int,int,int,int,int,int,int,int,int>
                             ((tuple<int,_int,_int,_int,_int,_int,_int,_int,_int> *)local_3c);
  uVar2 = *puVar9;
  puVar9 = (uint *)std::get<2ul,int,int,int,int,int,int,int,int,int>
                             ((tuple<int,_int,_int,_int,_int,_int,_int,_int,_int> *)local_3c);
  uVar3 = *puVar9;
  puVar9 = (uint *)std::get<3ul,int,int,int,int,int,int,int,int,int>
                             ((tuple<int,_int,_int,_int,_int,_int,_int,_int,_int> *)local_3c);
  uVar4 = *puVar9;
  puVar9 = (uint *)std::get<4ul,int,int,int,int,int,int,int,int,int>
                             ((tuple<int,_int,_int,_int,_int,_int,_int,_int,_int> *)local_3c);
  uVar5 = *puVar9;
  p_Var10 = std::get<5ul,int,int,int,int,int,int,int,int,int>
                      ((tuple<int,_int,_int,_int,_int,_int,_int,_int,_int> *)local_3c);
  _Var6 = *p_Var10;
  p_Var11 = std::get<6ul,int,int,int,int,int,int,int,int,int>
                      ((tuple<int,_int,_int,_int,_int,_int,_int,_int,_int> *)local_3c);
  _Var7 = *p_Var11;
  p_Var12 = std::get<7ul,int,int,int,int,int,int,int,int,int>
                      ((tuple<int,_int,_int,_int,_int,_int,_int,_int,_int> *)local_3c);
  _Var8 = *p_Var12;
  p_Var13 = std::get<8ul,int,int,int,int,int,int,int,int,int>
                      ((tuple<int,_int,_int,_int,_int,_int,_int,_int,_int> *)local_3c);
  printf("%d %d %d %d %d %d %d %d %d\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,
         (ulong)uVar5,_Var6,_Var7,_Var8,*p_Var13);
  return;
}

Assistant:

IUTEST_P(PairwiseTest, Num)
{
#ifndef USE_PROGRESS
    PairwiseTestTuple param = GetParam();
    printf("%d %d %d %d %d %d %d %d %d\n"
        , ::iutest::tuples::get<0>(param)
        , ::iutest::tuples::get<1>(param)
        , ::iutest::tuples::get<2>(param)
        , ::iutest::tuples::get<3>(param)
        , ::iutest::tuples::get<4>(param)
        , ::iutest::tuples::get<5>(param)
        , ::iutest::tuples::get<6>(param)
        , ::iutest::tuples::get<7>(param)
        , ::iutest::tuples::get<8>(param)
    );
#endif
}